

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogExecution.cpp
# Opt level: O2

void __thiscall wasm::LogExecution::run(LogExecution *this,Module *module)

{
  IString local_90;
  string local_80;
  string local_60;
  string local_40;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"log-execution",&local_1a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_19);
  Pass::getArgumentOrDefault(&local_80,(Pass *)this,&local_60,&local_40);
  IString::IString(&local_90,&local_80);
  (this->loggerModule).str._M_len = local_90.str._M_len;
  (this->loggerModule).str._M_str = local_90.str._M_str;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  WalkerPass<wasm::PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>_>::run
            (&this->
              super_WalkerPass<wasm::PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>_>
             ,module);
  return;
}

Assistant:

void run(Module* module) override {
    loggerModule = getArgumentOrDefault("log-execution", "");
    Super::run(module);
  }